

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int init_blocksize(vorb *f,int b,int n)

{
  float *pfVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  uint16 *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar11 = n * 2 & 0xfffffffc;
  pfVar3 = (float *)setup_malloc(f,uVar11);
  f->A[(uint)b] = pfVar3;
  pfVar3 = (float *)setup_malloc(f,uVar11);
  f->B[(uint)b] = pfVar3;
  pfVar4 = (float *)setup_malloc(f,n & 0xfffffffc);
  f->C[(uint)b] = pfVar4;
  pfVar3 = f->A[(uint)b];
  if ((pfVar3 != (float *)0x0) &&
     (pfVar1 = f->B[(uint)b], pfVar4 != (float *)0x0 && pfVar1 != (float *)0x0)) {
    dVar13 = (double)n;
    uVar2 = n >> 2;
    iVar8 = 0;
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = uVar2;
    }
    lVar9 = 1;
    for (; uVar12 << 2 != iVar8; iVar8 = iVar8 + 4) {
      dVar15 = ((double)iVar8 * 3.141592653589793) / dVar13;
      dVar14 = cos(dVar15);
      pfVar3[lVar9 + -1] = (float)dVar14;
      dVar14 = sin(dVar15);
      pfVar3[lVar9] = -(float)dVar14;
      dVar14 = (((double)(int)lVar9 * 3.141592653589793) / dVar13) * 0.5;
      dVar15 = cos(dVar14);
      pfVar1[lVar9 + -1] = (float)dVar15 * 0.5;
      dVar14 = sin(dVar14);
      pfVar1[lVar9] = (float)dVar14 * 0.5;
      lVar9 = lVar9 + 2;
    }
    uVar6 = 0;
    uVar7 = (ulong)(uint)(n >> 3);
    if (n >> 3 < 1) {
      uVar7 = uVar6;
    }
    for (; (int)uVar7 * 4 != (int)uVar6; uVar6 = uVar6 + 4) {
      dVar14 = ((double)((int)uVar6 + 2) * 3.141592653589793) / dVar13;
      dVar15 = cos(dVar14);
      *(float *)((long)pfVar4 + uVar6 * 2) = (float)dVar15;
      dVar14 = sin(dVar14);
      *(float *)((long)pfVar4 + uVar6 * 2 + 4) = -(float)dVar14;
    }
    pfVar3 = (float *)setup_malloc(f,uVar11);
    f->window[(uint)b] = pfVar3;
    if (pfVar3 != (float *)0x0) {
      uVar11 = n >> 1;
      uVar10 = 0;
      uVar6 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar6 = uVar10;
      }
      for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        dVar13 = sin((((double)(int)uVar10 + 0.5) / (double)(int)uVar11) * 0.5 * 3.141592653589793);
        dVar13 = sin((double)((float)dVar13 * (float)dVar13) * 1.5707963267948966);
        pfVar3[uVar10] = (float)dVar13;
      }
      puVar5 = (uint16 *)setup_malloc(f,uVar2 & 0xfffffffe);
      f->bit_reverse[(uint)b] = puVar5;
      if (puVar5 != (uint16 *)0x0) {
        iVar8 = ilog(n);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          uVar11 = (uint)uVar6;
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          uVar11 = (uVar11 & 0xf0f0f0f) << 4 | uVar11 >> 4 & 0xf0f0f0f;
          uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333) * 4;
          puVar5[uVar6] =
               (uint16)(((uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555) * 2 >>
                        (0x24U - (char)iVar8 & 0x1f)) << 2);
        }
        return 1;
      }
    }
  }
  f->error = VORBIS_outofmem;
  return 0;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}